

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isadetection.c
# Opt level: O0

uint64_t xgetbv(void)

{
  undefined4 in_XCR0;
  undefined4 in_register_00000604;
  uint32_t xcr0_hi;
  uint32_t xcr0_lo;
  
  return CONCAT44(in_register_00000604,in_XCR0);
}

Assistant:

static inline uint64_t xgetbv(void) {
#if defined(_MSC_VER)
    return _xgetbv(0);
#else
    uint32_t xcr0_lo, xcr0_hi;
    __asm__("xgetbv\n\t" : "=a"(xcr0_lo), "=d"(xcr0_hi) : "c"(0));
    return xcr0_lo | ((uint64_t)xcr0_hi << 32);
#endif
}